

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

bool __thiscall ArgsManager::SoftSetBoolArg(ArgsManager *this,string *strArg,bool fValue)

{
  bool bVar1;
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  allocator<char> local_39;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000011,fValue) == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"0",&local_39);
    bVar1 = SoftSetArg(this,strArg,&local_38);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"1",&local_39);
    bVar1 = SoftSetArg(this,strArg,&local_38);
  }
  std::__cxx11::string::~string((string *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::SoftSetBoolArg(const std::string& strArg, bool fValue)
{
    if (fValue)
        return SoftSetArg(strArg, std::string("1"));
    else
        return SoftSetArg(strArg, std::string("0"));
}